

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-a2.cpp
# Opt level: O2

void __thiscall
RasterizerA2::_renderImpl<CompositorScalar,false>(RasterizerA2 *this,uint32_t argb32)

{
  int iVar1;
  Image *pIVar2;
  long lVar3;
  Bounds *pBVar4;
  Cell *pCVar5;
  size_t sVar6;
  uint32_t mask;
  uint32_t bPix;
  int iVar7;
  uint32_t uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  uint32_t *dstPix;
  uint8_t *puVar13;
  ulong uVar14;
  long local_50;
  
  uVar10 = (ulong)(this->_yBounds).start;
  iVar1 = (this->_yBounds).end;
  pIVar2 = (this->super_CellRasterizer).super_Rasterizer._dst;
  lVar3 = pIVar2->_stride;
  puVar13 = pIVar2->_data + lVar3 * uVar10;
  bPix = PixelUtils::premultiply(argb32);
  local_50 = uVar10 * 8;
  for (; uVar10 <= (ulong)(long)iVar1; uVar10 = uVar10 + 1) {
    pBVar4 = this->_xBounds;
    if (pBVar4[uVar10].end != 0) {
      pCVar5 = this->_cells;
      uVar14 = (ulong)pBVar4[uVar10].start;
      iVar7 = pBVar4[uVar10].end + 1;
      iVar12 = (this->super_CellRasterizer).super_Rasterizer._width;
      if (iVar12 < iVar7) {
        iVar7 = iVar12;
      }
      sVar6 = this->_cellStride;
      pBVar4[uVar10].start = 0x7fffffff;
      pBVar4[uVar10].end = 0;
      lVar11 = sVar6 * local_50;
      iVar12 = 0;
      for (; uVar14 < (ulong)(long)iVar7; uVar14 = uVar14 + 1) {
        iVar12 = iVar12 + *(int32_t *)((long)&pCVar5[uVar14].cover + lVar11);
        uVar9 = iVar12 - ((uint)*(int32_t *)((long)&pCVar5[uVar14].area + lVar11) >> 9) & 0x1ff;
        mask = uVar9 ^ 0x1ff;
        if (uVar9 < 0x100) {
          mask = uVar9;
        }
        *(undefined8 *)((long)&pCVar5[uVar14].cover + lVar11) = 0;
        uVar8 = bPix;
        if (mask != 0xff) {
          uVar8 = PixelUtils::src(*(uint32_t *)(puVar13 + uVar14 * 4),bPix,mask);
        }
        *(uint32_t *)(puVar13 + uVar14 * 4) = uVar8;
      }
    }
    puVar13 = puVar13 + lVar3;
    local_50 = local_50 + 8;
  }
  (this->_yBounds).start = 0x7fffffff;
  (this->_yBounds).end = 0;
  return;
}

Assistant:

inline void RasterizerA2::_renderImpl(uint32_t argb32) noexcept {
  size_t y0 = size_t(_yBounds.start);
  size_t y1 = size_t(_yBounds.end);

  intptr_t stride = _dst->stride();
  uint8_t* dstLine = _dst->data() + y0 * stride;

  Compositor compositor(argb32);
  while (y0 <= y1) {
    uint32_t* dstPix = reinterpret_cast<uint32_t*>(dstLine);
    Cell* cell = &_cells[y0 * _cellStride];

    if (!_xBounds[y0].empty()) {
      int x0 = _xBounds[y0].start;
      int x1 = std::min(_xBounds[y0].end + 1, _width);
      _xBounds[y0].reset();

      int cover = 0;
      compositor.template vmask<NonZero>(dstPix, size_t(x0), size_t(x1), cell, cover);
    }

    y0++;
    dstLine += stride;
  }

  _yBounds.reset();
}